

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SelectWrongNumTermsError(Parse *pParse,Select *p)

{
  byte bVar1;
  char *pcVar2;
  
  if ((p->selFlags & 0x200) == 0) {
    bVar1 = p->op + 0x78;
    if (bVar1 < 3) {
      pcVar2 = (&PTR_anon_var_dwarf_7dc1c_0023f730)[bVar1];
    }
    else {
      pcVar2 = "UNION";
    }
    sqlite3ErrorMsg(pParse,
                    "SELECTs to the left and right of %s do not have the same number of result columns"
                    ,pcVar2);
    return;
  }
  sqlite3ErrorMsg(pParse,"all VALUES must have the same number of terms");
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectWrongNumTermsError(Parse *pParse, Select *p){
  if( p->selFlags & SF_Values ){
    sqlite3ErrorMsg(pParse, "all VALUES must have the same number of terms");
  }else{
    sqlite3ErrorMsg(pParse, "SELECTs to the left and right of %s"
      " do not have the same number of result columns",
      sqlite3SelectOpName(p->op));
  }
}